

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseStringName(xmlParserCtxtPtr ctxt,xmlChar **str)

{
  int iVar1;
  int iVar2;
  long lVar3;
  xmlChar *__dest;
  xmlChar *pxVar4;
  uint len;
  uint uVar5;
  xmlChar *pxVar6;
  int l;
  xmlChar buf [105];
  int local_bc;
  ulong local_b8;
  xmlChar **local_b0;
  xmlChar local_a8 [120];
  
  pxVar6 = *str;
  iVar1 = xmlStringCurrentChar(ctxt,pxVar6,&local_bc);
  iVar2 = xmlIsNameStartChar((xmlParserCtxtPtr)(ulong)(uint)ctxt->options,iVar1);
  if (iVar2 == 0) {
LAB_0015c9da:
    __dest = (xmlChar *)0x0;
  }
  else {
    if (local_bc == 1) {
      local_a8[0] = (xmlChar)iVar1;
      len = 1;
      lVar3 = 1;
    }
    else {
      len = xmlCopyCharMultiByte(local_a8,iVar1);
      lVar3 = (long)local_bc;
    }
    pxVar6 = pxVar6 + lVar3;
    iVar1 = xmlStringCurrentChar(ctxt,pxVar6,&local_bc);
    do {
      iVar2 = xmlIsNameChar((xmlParserCtxtPtr)(ulong)(uint)ctxt->options,iVar1);
      if (iVar2 == 0) {
        if (((int)len < 0xc351) || ((ctxt->options & 0x80000) != 0)) {
          *str = pxVar6;
          pxVar6 = xmlStrndup(local_a8,len);
          return pxVar6;
        }
        xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
        goto LAB_0015c9da;
      }
      if (local_bc == 1) {
        local_a8[(int)len] = (xmlChar)iVar1;
        lVar3 = 1;
        len = len + 1;
      }
      else {
        iVar1 = xmlCopyCharMultiByte(local_a8 + (int)len,iVar1);
        len = len + iVar1;
        lVar3 = (long)local_bc;
      }
      pxVar6 = pxVar6 + lVar3;
      iVar1 = xmlStringCurrentChar(ctxt,pxVar6,&local_bc);
    } while ((int)len < 100);
    local_b0 = str;
    __dest = (xmlChar *)(*xmlMallocAtomic)((ulong)(len * 2));
    if (__dest == (xmlChar *)0x0) {
      __dest = (xmlChar *)0x0;
      xmlErrMemory(ctxt,(char *)0x0);
    }
    else {
      memcpy(__dest,local_a8,(ulong)len);
      iVar2 = xmlIsNameChar((xmlParserCtxtPtr)(ulong)(uint)ctxt->options,iVar1);
      local_b8 = (ulong)(len * 2);
      while (iVar2 != 0) {
        pxVar4 = __dest;
        if ((int)local_b8 < (int)(len + 10)) {
          if ((50000 < (int)len) && ((ctxt->options & 0x80000) == 0)) {
            xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"NCName");
            (*xmlFree)(__dest);
            goto LAB_0015c9da;
          }
          local_b8 = (ulong)(uint)((int)local_b8 * 2);
          pxVar4 = (xmlChar *)(*xmlRealloc)(__dest,local_b8);
          if (pxVar4 == (xmlChar *)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            (*xmlFree)(__dest);
            return (xmlChar *)0x0;
          }
        }
        if (local_bc == 1) {
          uVar5 = len + 1;
          pxVar4[(int)len] = (xmlChar)iVar1;
        }
        else {
          iVar1 = xmlCopyCharMultiByte(pxVar4 + (int)len,iVar1);
          uVar5 = iVar1 + len;
        }
        pxVar6 = pxVar6 + local_bc;
        iVar1 = xmlStringCurrentChar(ctxt,pxVar6,&local_bc);
        iVar2 = xmlIsNameChar((xmlParserCtxtPtr)(ulong)(uint)ctxt->options,iVar1);
        __dest = pxVar4;
        len = uVar5;
      }
      __dest[(int)len] = '\0';
      *local_b0 = pxVar6;
    }
  }
  return __dest;
}

Assistant:

static xmlChar *
xmlParseStringName(xmlParserCtxtPtr ctxt, const xmlChar** str) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    const xmlChar *cur = *str;
    int len = 0, l;
    int c;

#ifdef DEBUG
    nbParseStringName++;
#endif

    c = CUR_SCHAR(cur, l);
    if (!xmlIsNameStartChar(ctxt, c)) {
	return(NULL);
    }

    COPY_BUF(l,buf,len,c);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (xmlIsNameChar(ctxt, c)) {
	COPY_BUF(l,buf,len,c);
	cur += l;
	c = CUR_SCHAR(cur, l);
	if (len >= XML_MAX_NAMELEN) { /* test bigentname.xml */
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

	    buffer = (xmlChar *) xmlMallocAtomic(max * sizeof(xmlChar));
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (xmlIsNameChar(ctxt, c)) {
		if (len + 10 > max) {
		    xmlChar *tmp;

                    if ((len > XML_MAX_NAME_LENGTH) &&
                        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
			xmlFree(buffer);
                        return(NULL);
                    }
		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer,
			                            max * sizeof(xmlChar));
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
		}
		COPY_BUF(l,buffer,len,c);
		cur += l;
		c = CUR_SCHAR(cur, l);
	    }
	    buffer[len] = 0;
	    *str = cur;
	    return(buffer);
	}
    }
    if ((len > XML_MAX_NAME_LENGTH) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
        xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "NCName");
        return(NULL);
    }
    *str = cur;
    return(xmlStrndup(buf, len));
}